

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextGLImpl::PrepareForDraw
          (DeviceContextGLImpl *this,DRAW_FLAGS Flags,bool IsIndexed,GLenum *GlTopology)

{
  GLContextState *ContextState;
  Uint32 *Args_2;
  PRIMITIVE_TOPOLOGY PVar1;
  PipelineStateGLImpl *this_00;
  GraphicsPipelineData *GraphicsPipeline;
  BufferGLImpl *pBVar2;
  Uint32 DrawBuffersMask;
  FBOCache *this_01;
  GLFrameBufferObj *pGVar3;
  GraphicsPipelineDesc *pGVar4;
  VAOCache *this_02;
  GLVertexArrayObj *VAO;
  uint uVar5;
  string msg;
  char (*in_stack_ffffffffffffffa8) [2];
  undefined1 local_50 [16];
  undefined8 local_40;
  undefined4 local_38;
  
  ContextState = &this->m_ContextState;
  if ((((this->m_ContextState).m_FBOId < 0) &&
      ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_NumBoundRenderTargets == 0))
     && ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundDepthStencil.
         m_pObject == (TextureViewGLImpl *)0x0)) {
    if (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_FramebufferWidth == 0) ||
       ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_FramebufferHeight == 0)) {
      FormatString<char[131]>
                ((string *)local_50,
                 (char (*) [131])
                 "Framebuffer width and height must be positive when rendering without attachments. Call SetViewports() to set the framebuffer size."
                );
      DebugAssertionFailed
                ((Char *)local_50._0_8_,"PrepareForDraw",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x2f5);
      if ((PipelineStateGLImpl *)local_50._0_8_ != (PipelineStateGLImpl *)&stack0xffffffffffffffc0)
      {
        operator_delete((void *)local_50._0_8_,(ulong)(local_40 + 1));
      }
    }
    this_01 = RenderDeviceGLImpl::GetFBOCache
                        ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pDevice.
                         m_pObject,(this->m_ContextState).m_CurrentGLContext);
    pGVar3 = FBOCache::GetFBO(this_01,(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                                      m_FramebufferWidth,
                              (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                              m_FramebufferHeight,ContextState);
    GLContextState::BindFBO(ContextState,pGVar3);
    this->m_DrawFBO = (GLFrameBufferObj *)0x0;
  }
  if (this->m_DrawBuffersCommitted == false) {
    if (((this->m_IsDefaultFBOBound == false) &&
        ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_NumBoundRenderTargets != 0)
        ) && ((this->m_DrawFBO != (GLFrameBufferObj *)0x0 &&
              (this_00 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                         m_pPipelineState.m_pObject, this_00 != (PipelineStateGLImpl *)0x0)))) {
      Args_2 = &(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                m_NumBoundRenderTargets;
      pGVar4 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                         (&this_00->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
      if (*Args_2 != (uint)pGVar4->NumRenderTargets) {
        pGVar4 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                           (&((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                              m_pPipelineState.m_pObject)->
                             super_PipelineStateBase<Diligent::EngineGLImplTraits>);
        FormatString<char[53],unsigned_char,char[54],unsigned_int,char[2]>
                  ((string *)local_50,
                   (Diligent *)"The number of render targets in the pipeline state (",
                   (char (*) [53])&pGVar4->NumRenderTargets,
                   (uchar *)") does not match the number of bound render targets (",
                   (char (*) [54])Args_2,(uint *)0x343766,in_stack_ffffffffffffffa8);
        DebugAssertionFailed
                  ((Char *)local_50._0_8_,"PrepareForDraw",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x305);
        if ((PipelineStateGLImpl *)local_50._0_8_ != (PipelineStateGLImpl *)&stack0xffffffffffffffc0
           ) {
          operator_delete((void *)local_50._0_8_,(ulong)(local_40 + 1));
        }
      }
      pGVar3 = this->m_DrawFBO;
      GraphicsPipeline =
           (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pPipelineState.
            m_pObject)->super_PipelineStateBase<Diligent::EngineGLImplTraits>).field_6.
           m_pGraphicsPipelineData;
      if (GraphicsPipeline == (GraphicsPipelineData *)0x0) {
        DrawBuffersMask = 0;
      }
      else {
        DrawBuffersMask = PipelineStateUtils::GetRenderTargetMask(&GraphicsPipeline->Desc);
      }
      GLObjectWrappers::GLFrameBufferObj::SetDrawBuffers(pGVar3,0xffffffff,DrawBuffersMask);
    }
    this->m_DrawBuffersCommitted = true;
  }
  DeviceContextBase<Diligent::EngineGLImplTraits>::DvpVerifyRenderTargets
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>);
  PipelineStateGLImpl::CommitProgram
            ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pPipelineState.
             m_pObject,ContextState);
  DeviceContextBase<Diligent::EngineGLImplTraits>::CommittedShaderResources::DvpVerifyCacheRevisions
            (&(this->m_BindInfo).super_CommittedShaderResources);
  uVar5 = (uint)(this->m_BindInfo).super_CommittedShaderResources.DynamicSRBMask;
  if ((Flags & DRAW_FLAG_DYNAMIC_RESOURCE_BUFFERS_INTACT) != DRAW_FLAG_NONE) {
    uVar5 = 0;
  }
  uVar5 = (uint)(this->m_BindInfo).super_CommittedShaderResources.ActiveSRBMask &
          (uVar5 | (this->m_BindInfo).super_CommittedShaderResources.StaleSRBMask);
  if (uVar5 != 0) {
    BindProgramResources(this,uVar5);
  }
  DvpValidateCommittedShaderResources(this);
  pGVar4 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                     (&((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                        m_pPipelineState.m_pObject)->
                       super_PipelineStateBase<Diligent::EngineGLImplTraits>);
  if ((this->m_ContextState).m_VAOId < 1) {
    this_02 = RenderDeviceGLImpl::GetVAOCache
                        ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pDevice.
                         m_pObject,(this->m_ContextState).m_CurrentGLContext);
    pBVar2 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pIndexBuffer.m_pObject;
    if ((pGVar4->InputLayout).NumElements == 0 && pBVar2 == (BufferGLImpl *)0x0) {
      VAO = VAOCache::GetEmptyVAO(this_02);
    }
    else {
      local_50._0_8_ =
           (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pPipelineState.m_pObject;
      local_40 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_VertexStreams;
      local_38 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_NumVertexStreams;
      local_50._8_8_ = pBVar2;
      VAO = VAOCache::GetVAO(this_02,(VAOAttribs *)local_50,ContextState);
    }
    GLContextState::BindVAO(ContextState,VAO);
  }
  PVar1 = pGVar4->PrimitiveTopology;
  if (PVar1 < 10) {
    *GlTopology = *(GLenum *)
                   (PrimitiveTopologyToGLTopology(Diligent::PRIMITIVE_TOPOLOGY)::
                    PrimTopologyToGLTopologyMap + (ulong)(uint)PVar1 * 4);
  }
  else {
    *GlTopology = 0xe;
    GLContextState::SetNumPatchVertices(ContextState,PVar1 - 9);
  }
  return;
}

Assistant:

void DeviceContextGLImpl::PrepareForDraw(DRAW_FLAGS Flags, bool IsIndexed, GLenum& GlTopology)
{
    if (!m_ContextState.IsValidFBOBound() && m_NumBoundRenderTargets == 0 && !m_pBoundDepthStencil)
    {
        // Framebuffer without attachments
        DEV_CHECK_ERR(m_FramebufferWidth > 0 && m_FramebufferHeight > 0,
                      "Framebuffer width and height must be positive when rendering without attachments. Call SetViewports() to set the framebuffer size.");
        FBOCache& FboCache = m_pDevice->GetFBOCache(m_ContextState.GetCurrentGLContext());

        const GLObjectWrappers::GLFrameBufferObj& FBO = FboCache.GetFBO(m_FramebufferWidth, m_FramebufferHeight, m_ContextState);
        m_ContextState.BindFBO(FBO);
        m_DrawFBO = nullptr;
    }

    if (!m_DrawBuffersCommitted)
    {
        if (!m_IsDefaultFBOBound && m_NumBoundRenderTargets > 0 && m_DrawFBO != nullptr)
        {
            if (m_pPipelineState)
            {
                VERIFY(m_pPipelineState->GetGraphicsPipelineDesc().NumRenderTargets == m_NumBoundRenderTargets,
                       "The number of render targets in the pipeline state (", m_pPipelineState->GetGraphicsPipelineDesc().NumRenderTargets,
                       ") does not match the number of bound render targets (", m_NumBoundRenderTargets, ")");
                m_DrawFBO->SetDrawBuffers(~0u, m_pPipelineState->GetRenderTargetMask());
            }
        }
        m_DrawBuffersCommitted = true;
    }

#ifdef DILIGENT_DEVELOPMENT
    DvpVerifyRenderTargets();
#endif

    // The program might have changed since the last SetPipelineState call if a shader was
    // created after the call (ShaderResourcesGL needs to bind a program to load uniforms).
    m_pPipelineState->CommitProgram(m_ContextState);
    if (Uint32 BindSRBMask = m_BindInfo.GetCommitMask(Flags & DRAW_FLAG_DYNAMIC_RESOURCE_BUFFERS_INTACT))
    {
        BindProgramResources(BindSRBMask);
    }

#ifdef DILIGENT_DEVELOPMENT
    // Must be called after BindProgramResources as it needs BaseBindings
    DvpValidateCommittedShaderResources();
#endif

    const GraphicsPipelineDesc& PipelineDesc = m_pPipelineState->GetGraphicsPipelineDesc();
    if (!m_ContextState.IsValidVAOBound())
    {
        VAOCache& VaoCache = m_pDevice->GetVAOCache(m_ContextState.GetCurrentGLContext());
        if (PipelineDesc.InputLayout.NumElements > 0 || m_pIndexBuffer != nullptr)
        {
            VAOCache::VAOAttribs vaoAttribs //
                {
                    *m_pPipelineState,
                    m_pIndexBuffer,
                    m_VertexStreams,
                    m_NumVertexStreams //
                };
            const GLObjectWrappers::GLVertexArrayObj& VAO = VaoCache.GetVAO(vaoAttribs, m_ContextState);
            m_ContextState.BindVAO(VAO);
        }
        else
        {
            // Draw command will fail if no VAO is bound. If no vertex description is set
            // (which is the case if, for instance, the command only inputs VertexID),
            // use empty VAO
            const GLObjectWrappers::GLVertexArrayObj& VAO = VaoCache.GetEmptyVAO();
            m_ContextState.BindVAO(VAO);
        }
    }

    PRIMITIVE_TOPOLOGY Topology = PipelineDesc.PrimitiveTopology;
    if (Topology >= PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST)
    {
#if GL_ARB_tessellation_shader
        GlTopology        = GL_PATCHES;
        Int32 NumVertices = static_cast<Int32>(Topology - PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST + 1);
        m_ContextState.SetNumPatchVertices(NumVertices);
#else
        UNSUPPORTED("Tessellation is not supported");
#endif
    }
    else
    {
        GlTopology = PrimitiveTopologyToGLTopology(Topology);
    }
}